

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shproject.hpp
# Opt level: O0

void __thiscall SymmSH<15>::SymmSH(SymmSH<15> *this,function<float_(float)> *func,int nsample)

{
  float fVar1;
  int iVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  float *local_450;
  int local_448;
  int local_444;
  int i_2;
  int i_1;
  float f;
  vec3f w;
  float theta;
  int i;
  float y [225];
  double local_98;
  double acc [15];
  int nsample_local;
  function<float_(float)> *func_local;
  SymmSH<15> *this_local;
  
  this->a[0] = 0.0;
  local_450 = this->a + 1;
  do {
    *local_450 = 0.0;
    local_450 = local_450 + 1;
  } while ((SymmSH<15> *)local_450 != this + 1);
  acc[0xe]._4_4_ = nsample;
  memset(&local_98,0,0x78);
  for (w.z = 0.0; (int)w.z < acc[0xe]._4_4_; w.z = (data_t)((int)w.z + 1)) {
    w.y = (PI * ((float)(int)w.z + 0.5)) / (float)acc[0xe]._4_4_;
    dVar4 = std::sin((double)(ulong)(uint)w.y);
    dVar5 = std::cos((double)(ulong)(uint)w.y);
    vec3f::vec3f((vec3f *)&i_1,SUB84(dVar4,0),0.0,SUB84(dVar5,0));
    SHEvaluate((vec3f *)&i_1,0xe,&theta);
    fVar3 = std::function<float_(float)>::operator()(func,w.y);
    for (local_444 = 0; local_444 < 0xf; local_444 = local_444 + 1) {
      iVar2 = SHIndex(local_444,0);
      fVar1 = (&theta)[iVar2];
      dVar4 = std::sin((double)(ulong)(uint)w.y);
      acc[(long)local_444 + -1] =
           (double)(fVar3 * fVar1 * SUB84(dVar4,0)) + acc[(long)local_444 + -1];
    }
  }
  for (local_448 = 0; local_448 < 0xf; local_448 = local_448 + 1) {
    this->a[local_448] =
         (float)((acc[(long)local_448 + -1] * 2.0 * (double)PI * (double)PI) /
                (double)acc[0xe]._4_4_);
  }
  return;
}

Assistant:

SymmSH<n>::SymmSH(std::function<float(float)> func, int nsample)
{
    double acc[n];
    memset(acc, 0, sizeof acc);
    float y[n*n];
    for (int i=0; i<nsample; ++i)
    {
        float theta = PI*(i+0.5)/nsample;
        vec3f w(sin(theta), 0, cos(theta));
        SHEvaluate(w, n-1, y);
        float f = func(theta);
        for (int i=0; i<n; ++i)
            acc[i] += f * y[SHIndex(i,0)] * sin(theta);
    }
    for (int i=0; i<n; ++i)
        a[i] = acc[i] * 2*PI*PI / nsample;
}